

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBuildHandler.cxx
# Opt level: O2

void __thiscall cmCTestBuildHandler::LaunchHelper::WriteLauncherConfig(LaunchHelper *this)

{
  cmCTest *this_00;
  ostream *poVar1;
  string srcdir;
  string fname;
  cmGeneratedFileStream fout;
  allocator<char> local_2e9;
  string local_2e8;
  cmAlphaNum local_2c8;
  string local_298;
  undefined1 local_278 [616];
  
  WriteScrapeMatchers(this,"Warning",&this->Handler->ReallyCustomWarningMatches);
  WriteScrapeMatchers(this,"WarningSuppress",&this->Handler->ReallyCustomWarningExceptions);
  local_278._8_8_ = (this->Handler->CTestLaunchDir)._M_dataplus._M_p;
  local_278._0_8_ = (this->Handler->CTestLaunchDir)._M_string_length;
  local_2c8.View_._M_len = (size_t)&DAT_00000018;
  local_2c8.View_._M_str = "/CTestLaunchConfig.cmake";
  cmStrCat<>(&local_298,(cmAlphaNum *)local_278,&local_2c8);
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_278,&local_298,false,None);
  this_00 = this->CTest;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2e8,"SourceDirectory",&local_2e9);
  cmCTest::GetCTestConfiguration((string *)&local_2c8,this_00,&local_2e8);
  std::__cxx11::string::~string((string *)&local_2e8);
  poVar1 = std::operator<<((ostream *)local_278,"set(CTEST_SOURCE_DIRECTORY \"");
  poVar1 = std::operator<<(poVar1,(string *)&local_2c8);
  std::operator<<(poVar1,"\")\n");
  std::__cxx11::string::~string((string *)&local_2c8);
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_278);
  std::__cxx11::string::~string((string *)&local_298);
  return;
}

Assistant:

void cmCTestBuildHandler::LaunchHelper::WriteLauncherConfig()
{
  this->WriteScrapeMatchers("Warning",
                            this->Handler->ReallyCustomWarningMatches);
  this->WriteScrapeMatchers("WarningSuppress",
                            this->Handler->ReallyCustomWarningExceptions);

  // Give some testing configuration information to the launcher.
  std::string fname =
    cmStrCat(this->Handler->CTestLaunchDir, "/CTestLaunchConfig.cmake");
  cmGeneratedFileStream fout(fname);
  std::string srcdir = this->CTest->GetCTestConfiguration("SourceDirectory");
  fout << "set(CTEST_SOURCE_DIRECTORY \"" << srcdir << "\")\n";
}